

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

DynamicObject * __thiscall
JsrtDebuggerObjectBase::GetChildren
          (JsrtDebuggerObjectBase *this,
          WeakArenaReference<Js::IDiagObjectModelWalkerBase> *walkerRef,ScriptContext *scriptContext
          ,uint fromCount,uint totalCount)

{
  IDiagObjectModelWalkerBase *pIVar1;
  IDiagObjectModelDisplay *pIVar2;
  code *pcVar3;
  bool bVar4;
  uint value;
  int iVar5;
  DynamicObject *object;
  JavascriptArray *instance;
  JavascriptArray *instance_00;
  undefined4 *puVar6;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar7;
  JsrtDebuggerObjectBase *pJVar8;
  undefined4 extraout_var;
  Var value_00;
  uint64 uVar9;
  uint64 uVar10;
  uint uVar11;
  uint uVar12;
  Var pvVar13;
  double dVar14;
  undefined1 local_e8 [8];
  ResolvedObject resolvedObject;
  BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> local_50;
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
  objectDisplayWeakRef;
  
  value = 0;
  resolvedObject._56_8_ = this;
  object = Js::JavascriptLibrary::CreateObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  instance = Js::JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  instance_00 = Js::JavascriptLibrary::CreateArray
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  bVar4 = Memory::ReferencedArenaAdapter::AddStrongReference(walkerRef->adapter);
  pIVar1 = walkerRef->p;
  if (pIVar1 != (IDiagObjectModelWalkerBase *)0x0 && bVar4) {
    value = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])(pIVar1);
    if (totalCount != 0 && fromCount < value) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      objectDisplayWeakRef.super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.
      ptr = (BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>)
            (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0;
      uVar12 = 0;
      do {
        local_e8._0_4_ = -1;
        resolvedObject.name._4_1_ = 0;
        resolvedObject.obj = (Var)0x0;
        resolvedObject.originalObj = (Var)0x0;
        resolvedObject.address = (IDiagObjectAddress *)0x0;
        resolvedObject.objectDisplay = (IDiagObjectModelDisplay *)0x0;
        resolvedObject.propId = 0;
        resolvedObject._4_4_ = 0;
        resolvedObject.scriptContext = (ScriptContext *)0x0;
        (**pIVar1->_vptr_IDiagObjectModelWalkerBase)
                  (pIVar1,(ulong)fromCount,(ResolvedObject *)local_e8);
        local_50.ptr = Js::ResolvedObject::GetObjectDisplay((ResolvedObject *)local_e8);
        pWVar7 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                           (&local_50);
        bVar4 = Memory::ReferencedArenaAdapter::AddStrongReference(pWVar7->adapter);
        pIVar2 = pWVar7->p;
        if (bVar4 && pIVar2 != (IDiagObjectModelDisplay *)0x0) {
          pJVar8 = JsrtDebuggerObjectProperty::Make
                             (*(JsrtDebuggerObjectsManager **)(resolvedObject._56_8_ + 0x10),
                              local_50.ptr);
          iVar5 = (*pJVar8->_vptr_JsrtDebuggerObjectBase[2])(pJVar8,resolvedObject._0_8_,0);
          value_00 = Js::CrossSite::MarshalVar
                               (scriptContext,(Var)CONCAT44(extraout_var,iVar5),false);
          iVar5 = (*pIVar2->_vptr_IDiagObjectModelDisplay[0xc])(pIVar2);
          if ((char)iVar5 == '\0') {
            uVar11 = (int)objectDisplayWeakRef.
                          super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.
                          ptr + 1;
            if ((int)objectDisplayWeakRef.
                     super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr < 0
               ) {
              dVar14 = (double)((ulong)objectDisplayWeakRef.
                                       super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>
                                       .ptr & 0xffffffff);
              objectDisplayWeakRef.
              super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._4_4_ = 0;
              objectDisplayWeakRef.
              super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._0_4_ =
                   uVar11;
              uVar9 = Js::NumberUtilities::ToSpecial(dVar14);
              objectDisplayWeakRef.
              super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._4_4_ = 0;
              bVar4 = Js::NumberUtilities::IsNan(dVar14);
              if (bVar4) {
                objectDisplayWeakRef.
                super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._4_4_ =
                     0;
                uVar10 = Js::NumberUtilities::ToSpecial(dVar14);
                if (uVar10 != 0xfff8000000000000) {
                  objectDisplayWeakRef.
                  super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._4_4_
                       = 0;
                  uVar10 = Js::NumberUtilities::ToSpecial(dVar14);
                  if (uVar10 != 0x7ff8000000000000) {
                    AssertCount = AssertCount + 1;
                    objectDisplayWeakRef.
                    super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr.
                    _4_4_ = 0;
                    Js::Throw::LogAssert();
                    *puVar6 = 1;
                    objectDisplayWeakRef.
                    super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr.
                    _4_4_ = 0;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/JavascriptNumber.inl"
                                       ,0xa2,
                                       "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                       ,"We should only produce a NaN with this value");
                    if (!bVar4) goto LAB_003abcdf;
                    *puVar6 = 0;
                  }
                }
              }
              pvVar13 = (Var)(uVar9 ^ 0xfffc000000000000);
            }
            else {
              pvVar13 = (Var)((ulong)objectDisplayWeakRef.
                                     super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>
                                     .ptr & 0xffffffff | 0x1000000000000);
            }
            objectDisplayWeakRef.
            super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._4_4_ = 0;
            objectDisplayWeakRef.
            super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr._0_4_ =
                 uVar11;
            Js::JavascriptOperators::OP_SetElementI
                      (instance,pvVar13,value_00,scriptContext,PropertyOperation_None);
          }
          else {
            if ((int)uVar12 < 0) {
              dVar14 = (double)uVar12;
              uVar9 = Js::NumberUtilities::ToSpecial(dVar14);
              bVar4 = Js::NumberUtilities::IsNan(dVar14);
              if (((bVar4) &&
                  (uVar10 = Js::NumberUtilities::ToSpecial(dVar14), uVar10 != 0xfff8000000000000))
                 && (uVar10 = Js::NumberUtilities::ToSpecial(dVar14), uVar10 != 0x7ff8000000000000))
              {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/JavascriptNumber.inl"
                                   ,0xa2,
                                   "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                   ,"We should only produce a NaN with this value");
                if (!bVar4) {
LAB_003abcdf:
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                *puVar6 = 0;
              }
              pvVar13 = (Var)(uVar9 ^ 0xfffc000000000000);
            }
            else {
              pvVar13 = (Var)((ulong)uVar12 | 0x1000000000000);
            }
            Js::JavascriptOperators::OP_SetElementI
                      (instance_00,pvVar13,value_00,scriptContext,PropertyOperation_None);
            uVar12 = uVar12 + 1;
          }
          pWVar7 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                             (&local_50);
          Memory::ReferencedArenaAdapter::ReleaseStrongReference(pWVar7->adapter);
          local_50.ptr = (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0;
        }
        AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::
        ~AutoPtr((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
                  *)&local_50);
        fromCount = fromCount + 1;
      } while ((fromCount < value) &&
              ((int)objectDisplayWeakRef.
                    super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.ptr +
               uVar12 < totalCount));
    }
    Memory::ReferencedArenaAdapter::ReleaseStrongReference(walkerRef->adapter);
  }
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x20,value,scriptContext);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x15,instance,scriptContext);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x4,instance_00,scriptContext);
  return object;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectBase::GetChildren(WeakArenaReference<Js::IDiagObjectModelWalkerBase>* walkerRef, Js::ScriptContext * scriptContext, uint fromCount, uint totalCount)
{
    Js::DynamicObject* childrensObject = scriptContext->GetLibrary()->CreateObject();

    uint propertiesArrayCount = 0;
    Js::JavascriptArray* propertiesArray = scriptContext->GetLibrary()->CreateArray();

    uint debuggerOnlyPropertiesArrayCount = 0;
    Js::JavascriptArray* debuggerOnlyPropertiesArray = scriptContext->GetLibrary()->CreateArray();

    Js::IDiagObjectModelWalkerBase* walker = walkerRef->GetStrongReference();

    uint32 childrensCount = 0;

    if (walker != nullptr)
    {
        try
        {
            childrensCount = walker->GetChildrenCount();
        }
        catch (const Js::JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
        }

        if (fromCount < childrensCount)
        {
            for (uint32 i = fromCount; i < childrensCount && (propertiesArrayCount + debuggerOnlyPropertiesArrayCount) < totalCount; ++i)
            {
                Js::ResolvedObject resolvedObject;

                try
                {
                    walker->Get(i, &resolvedObject);
                }
                catch (const Js::JavascriptException& err)
                {
                    Js::JavascriptExceptionObject* exception = err.GetAndClear();
                    Js::Var error = exception->GetThrownObject(scriptContext);
                    resolvedObject.obj = error;
                    resolvedObject.address = nullptr;
                    resolvedObject.scriptContext = exception->GetScriptContext();
                    resolvedObject.typeId = Js::JavascriptOperators::GetTypeId(error);
                    resolvedObject.name = _u("{error}");
                    resolvedObject.propId = Js::Constants::NoProperty;
                }

                AutoPtr<WeakArenaReference<Js::IDiagObjectModelDisplay>> objectDisplayWeakRef(resolvedObject.GetObjectDisplay());
                Js::IDiagObjectModelDisplay* resolvedObjectDisplay = objectDisplayWeakRef->GetStrongReference();
                if (resolvedObjectDisplay != nullptr)
                {
                    JsrtDebuggerObjectBase* debuggerObject = JsrtDebuggerObjectProperty::Make(this->GetDebuggerObjectsManager(), objectDisplayWeakRef);
                    try
                    {
                        Js::DynamicObject* object = debuggerObject->GetJSONObject(resolvedObject.scriptContext, /* forceSetValueProp */ false);
                        Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, object);
                        if (resolvedObjectDisplay->IsFake())
                        {
                            Js::JavascriptOperators::OP_SetElementI((Js::Var)debuggerOnlyPropertiesArray, Js::JavascriptNumber::ToVar(debuggerOnlyPropertiesArrayCount++, scriptContext), marshaledObj, scriptContext);
                        }
                        else
                        {
                            Js::JavascriptOperators::OP_SetElementI((Js::Var)propertiesArray, Js::JavascriptNumber::ToVar(propertiesArrayCount++, scriptContext), marshaledObj, scriptContext);
                        }
                    }
                    catch (const Js::JavascriptException& err)
                    {
                        err.GetAndClear();   // discard exception object
                    }
                    objectDisplayWeakRef->ReleaseStrongReference();
                    objectDisplayWeakRef.Detach();
                }
            }
        }

        walkerRef->ReleaseStrongReference();
    }

    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::totalPropertiesOfObject, childrensCount, scriptContext);
    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::properties, propertiesArray, scriptContext);
    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::debuggerOnlyProperties, debuggerOnlyPropertiesArray, scriptContext);

    return childrensObject;
}